

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_impl.h
# Opt level: O0

void __thiscall spdlog::logger::default_err_handler_(logger *this,string *msg)

{
  __atomic_base<long> *this_00;
  __int_type_conflict _Var1;
  logger *in_RDI;
  char date_buf [100];
  tm tm_time;
  time_t now;
  char local_b8 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  char (*in_stack_ffffffffffffff90) [100];
  char (*in_stack_ffffffffffffff98) [34];
  FILE *in_stack_ffffffffffffffa0;
  tm local_50;
  __atomic_base<long> *local_18 [3];
  
  this_00 = (__atomic_base<long> *)time((time_t *)0x0);
  local_18[0] = this_00;
  _Var1 = std::__atomic_base::operator_cast_to_long((__atomic_base<long> *)in_RDI);
  if (0x3b < (long)this_00 - _Var1) {
    std::__atomic_base<long>::operator=(this_00,(__int_type_conflict)in_RDI);
    details::os::localtime((os *)&local_50,(time_t *)local_18);
    strftime(local_b8,100,"%Y-%m-%d %H:%M:%S",&local_50);
    name_abi_cxx11_(in_RDI);
    fmt::v5::print<char[34],char[100],std::__cxx11::string,std::__cxx11::string>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  }
  return;
}

Assistant:

inline void spdlog::logger::default_err_handler_(const std::string &msg)
{
    auto now = time(nullptr);
    if (now - last_err_time_ < 60)
    {
        return;
    }
    last_err_time_ = now;
    auto tm_time = details::os::localtime(now);
    char date_buf[100];
    std::strftime(date_buf, sizeof(date_buf), "%Y-%m-%d %H:%M:%S", &tm_time);
    fmt::print(stderr, "[*** LOG ERROR ***] [{}] [{}] {}\n", date_buf, name(), msg);
}